

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

Result * __thiscall
CoreML::Model::addOutput
          (Result *__return_storage_ptr__,Model *this,string *targetName,FeatureType *targetType)

{
  element_type *peVar1;
  string *psVar2;
  ModelDescription *this_00;
  Type *pTVar3;
  FeatureType *pFVar4;
  
  peVar1 = (this->m_spec).
           super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->description_ == (ModelDescription *)0x0) {
    this_00 = (ModelDescription *)operator_new(0x78);
    Specification::ModelDescription::ModelDescription(this_00);
    peVar1->description_ = this_00;
  }
  pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(peVar1->description_->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  psVar2 = (pTVar3->name_).ptr_;
  if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&pTVar3->name_,targetName);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  pFVar4 = FeatureType::allocateCopy(targetType);
  if (pTVar3->type_ != (FeatureType *)0x0) {
    (*(pTVar3->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pTVar3->type_ = pFVar4;
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result Model::addOutput(const std::string& targetName,
                            FeatureType targetType) {
        Specification::ModelDescription* interface = m_spec->mutable_description();
        Specification::FeatureDescription *arg = interface->add_output();
        arg->set_name(targetName);
        arg->set_allocated_type(targetType.allocateCopy());
        return Result();
    }